

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_mesh.cpp
# Opt level: O0

Edge __thiscall
geometrycentral::surface::SurfaceMesh::separateToNewEdge
          (SurfaceMesh *this,Halfedge heA,Halfedge heB)

{
  Halfedge he_00;
  Halfedge he_01;
  bool bVar1;
  runtime_error *prVar2;
  size_t sVar3;
  size_t sVar4;
  reference pvVar5;
  SurfaceMesh *in_RDI;
  Halfedge he;
  NavigationIteratorBase<geometrycentral::surface::EdgeAdjacentHalfedgeNavigator> __end2;
  NavigationIteratorBase<geometrycentral::surface::EdgeAdjacentHalfedgeNavigator> __begin2;
  NavigationSetBase<geometrycentral::surface::EdgeAdjacentHalfedgeNavigator> *__range2;
  Edge e;
  Edge newE;
  NavigationIteratorBase<geometrycentral::surface::EdgeAdjacentHalfedgeNavigator>
  *in_stack_fffffffffffffe78;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar6;
  NavigationIteratorBase<geometrycentral::surface::EdgeAdjacentHalfedgeNavigator>
  *in_stack_fffffffffffffe80;
  NavigationSetBase<geometrycentral::surface::EdgeAdjacentHalfedgeNavigator>
  *in_stack_fffffffffffffe90;
  SurfaceMesh *in_stack_fffffffffffffed0;
  ParentMeshT *in_stack_fffffffffffffed8;
  size_t in_stack_fffffffffffffee0;
  Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh> local_e8;
  NavigationIteratorBase<geometrycentral::surface::EdgeAdjacentHalfedgeNavigator> local_d8 [2];
  NavigationSetBase<geometrycentral::surface::EdgeAdjacentHalfedgeNavigator> local_a8;
  NavigationSetBase<geometrycentral::surface::EdgeAdjacentHalfedgeNavigator> *local_80;
  Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh> local_78;
  Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh> local_68;
  Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh> local_58;
  Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh> local_30;
  Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh> local_20;
  Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh> local_10;
  
  bVar1 = usesImplicitTwin(in_RDI);
  if (bVar1) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error
              (prVar2,
               "Cannot separate edge from manifold mesh; all are already manifold. Try general SurfaceMesh."
              );
    __cxa_throw(prVar2,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
  }
  local_58 = (Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>)
             Halfedge::edge((Halfedge *)in_stack_fffffffffffffe80);
  local_68 = (Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>)
             Halfedge::edge((Halfedge *)in_stack_fffffffffffffe80);
  bVar1 = Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>::operator!=
                    ((Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>
                      *)in_stack_fffffffffffffe80,
                     (Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>
                      *)in_stack_fffffffffffffe78);
  if (bVar1) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error(prVar2,"halfedges must be incident on same edge");
    __cxa_throw(prVar2,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
  }
  bVar1 = Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>::
          operator==(&local_20,&local_30);
  if (bVar1) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error(prVar2,"halfedges must be distinct");
    __cxa_throw(prVar2,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
  }
  local_78 = (Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>)
             Halfedge::edge((Halfedge *)in_stack_fffffffffffffe80);
  sVar3 = Edge::degree((Edge *)in_RDI);
  if (sVar3 < 3) {
    local_10 = local_78;
  }
  else {
    local_10 = (Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>)
               getNewEdge(in_stack_fffffffffffffed0);
    Edge::adjacentHalfedges((Edge *)in_stack_fffffffffffffe90);
    local_80 = &local_a8;
    NavigationSetBase<geometrycentral::surface::EdgeAdjacentHalfedgeNavigator>::begin
              (in_stack_fffffffffffffe90);
    NavigationSetBase<geometrycentral::surface::EdgeAdjacentHalfedgeNavigator>::end
              (local_d8,local_80);
    while (bVar1 = NavigationIteratorBase<geometrycentral::surface::EdgeAdjacentHalfedgeNavigator>::
                   operator!=(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78), bVar1) {
      local_e8 = (Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                 )NavigationIteratorBase<geometrycentral::surface::EdgeAdjacentHalfedgeNavigator>::
                  operator*((NavigationIteratorBase<geometrycentral::surface::EdgeAdjacentHalfedgeNavigator>
                             *)0x237c4a);
      bVar1 = Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>::
              operator!=((Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                          *)in_stack_fffffffffffffe80,
                         (Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                          *)in_stack_fffffffffffffe78);
      if ((bVar1) &&
         (bVar1 = Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                  ::operator!=((Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                                *)in_stack_fffffffffffffe80,
                               (Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                                *)in_stack_fffffffffffffe78), bVar1)) {
        in_stack_fffffffffffffed0 =
             (SurfaceMesh *)
             Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>::
             getIndex(&local_e8);
        pvVar6 = &in_RDI->eHalfedgeArr;
        sVar3 = Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>::
                getIndex(&local_78);
        pvVar5 = ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (pvVar6,sVar3);
        *pvVar5 = (value_type)in_stack_fffffffffffffed0;
        break;
      }
      NavigationIteratorBase<geometrycentral::surface::EdgeAdjacentHalfedgeNavigator>::operator++
                (in_stack_fffffffffffffe80);
    }
    he_00.super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
    ind = in_stack_fffffffffffffee0;
    he_00.super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
    mesh = in_stack_fffffffffffffed8;
    removeFromSiblingList(in_stack_fffffffffffffed0,he_00);
    he_01.super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
    ind = in_stack_fffffffffffffee0;
    he_01.super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
    mesh = in_stack_fffffffffffffed8;
    removeFromSiblingList(in_stack_fffffffffffffed0,he_01);
    sVar3 = Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>::
            getIndex(&local_20);
    pvVar6 = &in_RDI->eHalfedgeArr;
    sVar4 = Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>::getIndex
                      (&local_10);
    pvVar5 = ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](pvVar6,sVar4);
    *pvVar5 = sVar3;
    sVar3 = Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>::getIndex
                      (&local_10);
    pvVar6 = &in_RDI->heEdgeArr;
    sVar4 = Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>::
            getIndex(&local_20);
    pvVar5 = ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](pvVar6,sVar4);
    *pvVar5 = sVar3;
    sVar3 = Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>::getIndex
                      (&local_10);
    pvVar6 = &in_RDI->heEdgeArr;
    sVar4 = Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>::
            getIndex(&local_30);
    pvVar5 = ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](pvVar6,sVar4);
    *pvVar5 = sVar3;
    sVar3 = Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>::
            getIndex(&local_30);
    pvVar6 = &in_RDI->heSiblingArr;
    sVar4 = Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>::
            getIndex(&local_20);
    pvVar5 = ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](pvVar6,sVar4);
    *pvVar5 = sVar3;
    sVar3 = Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>::
            getIndex(&local_20);
    pvVar6 = &in_RDI->heSiblingArr;
    sVar4 = Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>::
            getIndex(&local_30);
    pvVar5 = ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](pvVar6,sVar4);
    *pvVar5 = sVar3;
    in_RDI->modificationTick = in_RDI->modificationTick + 1;
  }
  return (Edge)local_10;
}

Assistant:

Edge SurfaceMesh::separateToNewEdge(Halfedge heA, Halfedge heB) {
  if (usesImplicitTwin())
    throw std::runtime_error(
        "Cannot separate edge from manifold mesh; all are already manifold. Try general SurfaceMesh.");

  if (heA.edge() != heB.edge()) throw std::runtime_error("halfedges must be incident on same edge");
  if (heA == heB) throw std::runtime_error("halfedges must be distinct");

  // If theres <= 2 halfedges incident on the edge, we don't have any work to do.
  Edge e = heA.edge();
  if (e.degree() <= 2) return e;

  Edge newE = getNewEdge();

  // find some other halfedge incident on the old edge, make it e.halfedge()
  for (Halfedge he : e.adjacentHalfedges()) {
    if (he != heA && he != heB) {
      eHalfedgeArr[e.getIndex()] = he.getIndex();
      break;
    }
  }

  removeFromSiblingList(heA);
  removeFromSiblingList(heB);

  eHalfedgeArr[newE.getIndex()] = heA.getIndex();
  heEdgeArr[heA.getIndex()] = newE.getIndex();
  heEdgeArr[heB.getIndex()] = newE.getIndex();
  heSiblingArr[heA.getIndex()] = heB.getIndex();
  heSiblingArr[heB.getIndex()] = heA.getIndex();


  modificationTick++;
  return newE;
}